

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# required_fields_test.cc
# Opt level: O2

void __thiscall
RequiredFieldsTest_TestRequired_Test<Proto2Type>::TestBody
          (RequiredFieldsTest_TestRequired_Test<Proto2Type> *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view json;
  string_view json_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view json_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  string_view json_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  string_view json_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  string_view json_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  string_view json_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  string_view json_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  string_view json_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  string_view json_08;
  allocator_type local_9b;
  allocator<char> local_9a;
  allocator_type local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  allocator_type local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"required_message",&local_9a);
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l,&local_9b);
  json._M_str = "{}";
  json._M_len = 2;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  json_00._M_str = "{\"required_message\": {}}";
  json_00._M_len = 0x18;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_00,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"required_message",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"optional_message.required_message",(allocator<char> *)&local_9b);
  __l_00._M_len = 2;
  __l_00._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_00,&local_99);
  json_01._M_str = "\n      {\n        \"optional_message\": {}\n      }\n      ";
  json_01._M_len = 0x36;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_01,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_78._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"required_message",&local_9a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"optional_message.required_message",(allocator<char> *)&local_9b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,"optional_message.repeated_message[1].required_int32",
             (allocator<char> *)&local_99);
  __l_01._M_len = 3;
  __l_01._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_01,&local_79);
  json_02._M_str =
       "\n      {\n        \"optional_message\": {\n          \"repeated_message\": [\n            {\"required_int32\": 1},\n            {},\n            {\"required_int32\": 2}\n          ]\n        }\n      }\n      "
  ;
  json_02._M_len = 0xc0;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_02,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_78._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_int32_message[5].required_int32",&local_9a);
  __l_02._M_len = 1;
  __l_02._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_02,&local_9b);
  json_03._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_int32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_03._M_len = 0xbe;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_03,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_int64_message[5].required_int32",&local_9a);
  __l_03._M_len = 1;
  __l_03._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_03,&local_9b);
  json_04._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_int64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_04._M_len = 0xbe;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_04,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_uint32_message[5].required_int32",&local_9a);
  __l_04._M_len = 1;
  __l_04._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_04,&local_9b);
  json_05._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_uint32_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_05._M_len = 0xbf;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_05,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_uint64_message[5].required_int32",&local_9a);
  __l_05._M_len = 1;
  __l_05._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_05,&local_9b);
  json_06._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_uint64_message\": {\n          \"1\": {\"required_int32\": 1},\n          \"5\": {},\n          \"9\": {\"required_int32\": 1}\n        }\n      }\n      "
  ;
  json_06._M_len = 0xbf;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_06,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_bool_message[true].required_int32",&local_9a);
  __l_06._M_len = 1;
  __l_06._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_06,&local_9b);
  json_07._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_bool_message\": {\n          \"false\": {\"required_int32\": 1},\n          \"true\": {}\n        }\n      }\n      "
  ;
  json_07._M_len = 0x9e;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_07,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"map_string_message[\"d\\\"ef\"].required_int32",&local_9a);
  __l_07._M_len = 1;
  __l_07._M_array = &local_78;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_98,__l_07,&local_9b);
  json_08._M_str =
       "\n      {\n        \"required_message\": {},\n        \"map_string_message\": {\n          \"abc\": {\"required_int32\": 1},\n          \"d\\\"ef\": {}\n        }\n      }\n      "
  ;
  json_08._M_len = 0x9f;
  RequiredFieldsTest<Proto2Type>::CheckRequired
            (&this->super_RequiredFieldsTest<Proto2Type>,json_08,&local_98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

TYPED_TEST(RequiredFieldsTest, TestRequired) {
  TestFixture::CheckRequired(R"json({})json", {"required_message"});
  TestFixture::CheckRequired(R"json({"required_message": {}})json", {});
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {}
      }
      )json",
      {"required_message", "optional_message.required_message"});

  // Repeated field.
  TestFixture::CheckRequired(
      R"json(
      {
        "optional_message": {
          "repeated_message": [
            {"required_int32": 1},
            {},
            {"required_int32": 2}
          ]
        }
      }
      )json",
      {"required_message", "optional_message.required_message",
       "optional_message.repeated_message[1].required_int32"});

  // Int32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int32_message[5].required_int32"});

  // Int64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_int64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_int64_message[5].required_int32"});

  // Uint32 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint32_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint32_message[5].required_int32"});

  // Uint64 map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_uint64_message": {
          "1": {"required_int32": 1},
          "5": {},
          "9": {"required_int32": 1}
        }
      }
      )json",
      {"map_uint64_message[5].required_int32"});

  // Bool map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_bool_message": {
          "false": {"required_int32": 1},
          "true": {}
        }
      }
      )json",
      {"map_bool_message[true].required_int32"});

  // String map key.
  TestFixture::CheckRequired(
      R"json(
      {
        "required_message": {},
        "map_string_message": {
          "abc": {"required_int32": 1},
          "d\"ef": {}
        }
      }
      )json",
      {R"(map_string_message["d\"ef"].required_int32)"});
}